

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_ConstAcc.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_ConstAcc::ArchiveIN(ChFunction_ConstAcc *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_ConstAcc>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30 = &this->h;
  local_38 = "h";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->end;
  local_38 = "end";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->aw;
  local_38 = "aw";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->av;
  local_38 = "av";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_ConstAcc::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_ConstAcc>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(h);
    marchive >> CHNVP(end);
    marchive >> CHNVP(aw);
    marchive >> CHNVP(av);
}